

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O0

void build_gamma_table(int gamma)

{
  long local_28;
  long diff;
  long value;
  int local_10;
  int n;
  int i;
  int gamma_local;
  
  gamma_table[0] = '\0';
  gamma_table[0xff] = 0xff;
  for (local_10 = 1; local_10 < 0xff; local_10 = local_10 + 1) {
    value._4_4_ = 1;
    diff = 0x10000;
    for (local_28 = (long)gamma_helper[local_10] * (long)(gamma + -0x100); local_28 != 0;
        local_28 = ((local_28 / 0x100) * (long)gamma_helper[local_10] * (long)(gamma + -0x100)) /
                   (long)(value._4_4_ * 0x100)) {
      diff = local_28 + diff;
      value._4_4_ = value._4_4_ + 1;
    }
    gamma_table[local_10] = (uint8_t)(((diff / 0x100) * (long)local_10) / 0x100);
  }
  return;
}

Assistant:

void build_gamma_table(int gamma)
{
	int i, n;

	/*
	 * value is the current sum.
	 * diff is the new term to add to the series.
	 */
	long value, diff;

	/* Hack - convergence is bad in these cases. */
	gamma_table[0] = 0;
	gamma_table[255] = 255;

	for (i = 1; i < 255; i++) {
		/*
		 * Initialise the Taylor series
		 *
		 * value and diff have been scaled by 256
		 */
		n = 1;
		value = 256L * 256L;
		diff = ((long)gamma_helper[i]) * (gamma - 256);

		while (diff) {
			value += diff;
			n++;

			/*
			 * Use the following identiy to calculate the gamma table.
			 * exp(x) = 1 + x + x^2/2 + x^3/(2*3) + x^4/(2*3*4) +...
			 *
			 * n is the current term number.
			 *
			 * The gamma_helper array contains a table of
			 * ln(x/256) * 256
			 * This is used because a^b = exp(b*ln(a))
			 *
			 * In this case:
			 * a is i / 256
			 * b is gamma.
			 *
			 * Note that everything is scaled by 256 for accuracy,
			 * plus another factor of 256 for the final result to
			 * be from 0-255.  Thus gamma_helper[] * gamma must be
			 * divided by 256*256 each itteration, to get back to
			 * the original power series.
			 */
			diff = (((diff / 256) * gamma_helper[i]) *
					(gamma - 256)) / (256 * n);
		}

		/*
		 * Store the value in the table so that the
		 * floating point pow function isn't needed.
		 */
		gamma_table[i] = (uint8_t)(((long)(value / 256) * i) / 256);
	}
}